

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall deqp::egl::anon_unknown_1::InfiniteLoop::setup(InfiniteLoop *this)

{
  Functions *gl;
  glUseProgramFunc p_Var1;
  glGetAttribLocationFunc p_Var2;
  glGetUniformLocationFunc p_Var3;
  bool bVar4;
  deUint32 dVar5;
  GLenum GVar6;
  deBool dVar7;
  GLint GVar8;
  TestError *pTVar9;
  GLint iterCount;
  GLint iterCountLocation;
  GLfloat coords [8];
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  InfiniteLoop *this_local;
  
  gl = (this->super_ContextReset).m_gl;
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  genSources(&local_1b0,this);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,gl,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  glu::operator<<((this->super_ContextReset).m_log,(ShaderProgram *)local_e0);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (!bVar4) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
               ,0x33b);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  do {
    p_Var1 = ((this->super_ContextReset).m_gl)->useProgram;
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    (*p_Var1)(dVar5);
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"useProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x33d);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  if ((this->super_ContextReset).m_shaderType == SHADERTYPE_COMPUTE) {
    this->m_outputBuffer = 0;
    do {
      (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_outputBuffer);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,"genBuffers(1, &m_outputBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x343);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bindBuffer)(0x90d2,this->m_outputBuffer);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,"bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x344);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bufferData)(0x90d2,4,(void *)0x0,0x88e8);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,
                      "bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), DE_NULL, GL_DYNAMIC_DRAW)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x345);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bindBufferBase)(0x90d2,0,this->m_outputBuffer);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,"bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x346);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
  }
  else {
    coords[2] = 1.0;
    coords[3] = 1.0;
    coords[4] = -1.0;
    coords[5] = 1.0;
    _iterCount = 0xbf800000bf800000;
    coords[0] = 1.0;
    coords[1] = -1.0;
    p_Var2 = ((this->super_ContextReset).m_gl)->getAttribLocation;
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    GVar8 = (*p_Var2)(dVar5,"a_position");
    this->m_coordLocation = GVar8;
    GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
    glu::checkError(GVar6,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                    ,0x353);
    do {
      dVar7 = ::deGetFalse();
      if ((dVar7 != 0) || (this->m_coordLocation == -1)) {
        pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar9,(char *)0x0,"m_coordLocation != (glw::GLint)-1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                   ,0x354);
        __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    this->m_coordinatesBuffer = 0;
    do {
      (*((this->super_ContextReset).m_gl)->genBuffers)(1,&this->m_coordinatesBuffer);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,"genBuffers(1, &m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x358);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bindBuffer)(0x8892,this->m_coordinatesBuffer);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,"bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x359);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->bufferData)(0x8892,0x20,&iterCount,0x88e4);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,
                      "bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x35a);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->enableVertexAttribArray)(this->m_coordLocation);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,"enableVertexAttribArray(m_coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x35b);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
    do {
      (*((this->super_ContextReset).m_gl)->vertexAttribPointer)
                (this->m_coordLocation,2,0x1406,'\0',0,(void *)0x0);
      GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
      glu::checkError(GVar6,
                      "vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                      ,0x35c);
      dVar7 = ::deGetFalse();
    } while (dVar7 != 0);
  }
  p_Var3 = ((this->super_ContextReset).m_gl)->getUniformLocation;
  dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  GVar8 = (*p_Var3)(dVar5,"u_iterCount");
  GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
  glu::checkError(GVar6,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x360);
  while ((dVar7 = ::deGetFalse(), dVar7 == 0 && (GVar8 != -1))) {
    dVar7 = ::deGetFalse();
    if (dVar7 == 0) {
      do {
        (*((this->super_ContextReset).m_gl)->uniform1i)(GVar8,-1);
        GVar6 = (*((this->super_ContextReset).m_gl)->getError)();
        glu::checkError(GVar6,"uniform1i(iterCountLocation, iterCount)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                        ,0x365);
        dVar7 = ::deGetFalse();
      } while (dVar7 != 0);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
      return;
    }
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,(char *)0x0,"iterCountLocation != (glw::GLint)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
             ,0x361);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void InfiniteLoop::setup (void)
{
	glu::ShaderProgram program (m_gl, genSources());
	m_log << program;

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	if (m_shaderType == SHADERTYPE_COMPUTE)
	{
		// Output buffer setup
		m_outputBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_outputBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_SHADER_STORAGE_BUFFER, m_outputBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_SHADER_STORAGE_BUFFER, sizeof(int), DE_NULL, GL_DYNAMIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_outputBuffer));
	}
	else
	{
		const glw::GLfloat coords[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
			-1.0f, +1.0f
		};

		m_coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_position");
		GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
		TCU_CHECK(m_coordLocation != (glw::GLint)-1);

		// Load the vertex data
		m_coordinatesBuffer = 0;
		GLU_CHECK_GLW_CALL(m_gl, genBuffers(1, &m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bindBuffer(GL_ARRAY_BUFFER, m_coordinatesBuffer));
		GLU_CHECK_GLW_CALL(m_gl, bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)sizeof(coords), coords, GL_STATIC_DRAW));
		GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(m_coordLocation));
		GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(m_coordLocation, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL));
	}

	glw::GLint iterCountLocation = m_gl.getUniformLocation(program.getProgram(), "u_iterCount");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(iterCountLocation != (glw::GLint)-1);

	// Set the iteration count (infinite)
	glw::GLint iterCount = -1;
	GLU_CHECK_GLW_CALL(m_gl, uniform1i(iterCountLocation, iterCount));
}